

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-ping-pongs.c
# Opt level: O2

void pinger_read_cb(uv_udp_t *udp,ssize_t nread,uv_buf_t *buf,sockaddr *addr,uint flags)

{
  pinger_t_conflict *pinger;
  undefined1 auVar1 [16];
  uint64_t uVar2;
  long lVar3;
  
  pinger = (pinger_t_conflict *)udp->data;
  lVar3 = 0;
  if (nread < 1) {
    nread = lVar3;
  }
  while( true ) {
    if (nread == lVar3) {
      return;
    }
    if (buf->base[lVar3] != PING[pinger->state]) break;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)pinger->state + 1;
    pinger->state = SUB164(auVar1 % ZEXT816(5),0);
    if (SUB168(auVar1 % ZEXT816(5),0) == 0) {
      pinger->pongs = pinger->pongs + 1;
      uVar2 = uv_now(loop);
      if (5000 < uVar2 - start_time) {
        uv_close((uv_handle_t *)udp,pinger_close_cb);
        return;
      }
      pinger_write_ping(pinger);
    }
    lVar3 = lVar3 + 1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-ping-udp.c"
          ,99,"buf->base[i] == PING[pinger->state]");
  abort();
}

Assistant:

static void pinger_read_cb(uv_stream_t* tcp,
                           ssize_t nread,
                           const uv_buf_t* buf) {
  ssize_t i;
  pinger_t* pinger;

  pinger = (pinger_t*)tcp->data;

  if (nread < 0) {
    ASSERT(nread == UV_EOF);

    if (buf->base) {
      buf_free(buf);
    }

    ASSERT(pinger_shutdown_cb_called == 1);
    uv_close((uv_handle_t*)tcp, pinger_close_cb);

    return;
  }

  /* Now we count the pings */
  for (i = 0; i < nread; i++) {
    ASSERT(buf->base[i] == PING[pinger->state]);
    pinger->state = (pinger->state + 1) % (sizeof(PING) - 1);
    if (pinger->state == 0) {
      pinger->pongs++;
      if (uv_now(loop) - start_time > TIME) {
        uv_shutdown(&pinger->shutdown_req,
                    (uv_stream_t*) tcp,
                    pinger_shutdown_cb);
        break;
      } else {
        pinger_write_ping(pinger);
      }
    }
  }

  buf_free(buf);
}